

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_getstr(Table *t,TString *key)

{
  int *piVar1;
  Node *pNVar2;
  TValue *pTVar3;
  TValue ko;
  Value local_10;
  ulong local_8;
  
  if (key->tt != '\x04') {
    local_8 = CONCAT71(local_8._1_7_,key->tt) | 0x40;
    local_10 = (Value)key;
    pTVar3 = getgeneric(t,(TValue *)&local_10,0);
    return pTVar3;
  }
  pNVar2 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash);
  while (((pNVar2->u).key_tt != 'D' || ((TString *)(pNVar2->u).key_val.gc != key))) {
    piVar1 = &(pNVar2->u).next;
    pNVar2 = pNVar2 + *piVar1;
    if ((long)*piVar1 == 0) {
      return &absentkey;
    }
  }
  return (TValue *)pNVar2;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  if (key->tt == LUA_VSHRSTR)
    return luaH_getshortstr(t, key);
  else {  /* for long strings, use generic case */
    TValue ko;
    setsvalue(cast(lua_State *, NULL), &ko, key);
    return getgeneric(t, &ko, 0);
  }
}